

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void * ma_aligned_malloc(size_t sz,size_t alignment,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *pvVar1;
  long in_RSI;
  void *pAligned;
  void *pUnaligned;
  size_t extraBytes;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = (void *)0x0;
  }
  else {
    pvVar1 = ma_malloc(in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x1d9c5c);
    if (pvVar1 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      local_8 = (void *)((long)pvVar1 + in_RSI + 7 & (in_RSI - 1U ^ 0xffffffffffffffff));
      *(void **)((long)local_8 - 8) = pvVar1;
    }
  }
  return local_8;
}

Assistant:

MA_API void* ma_aligned_malloc(size_t sz, size_t alignment, const ma_allocation_callbacks* pAllocationCallbacks)
{
    size_t extraBytes;
    void* pUnaligned;
    void* pAligned;

    if (alignment == 0) {
        return 0;
    }

    extraBytes = alignment-1 + sizeof(void*);

    pUnaligned = ma_malloc(sz + extraBytes, pAllocationCallbacks);
    if (pUnaligned == NULL) {
        return NULL;
    }

    pAligned = (void*)(((ma_uintptr)pUnaligned + extraBytes) & ~((ma_uintptr)(alignment-1)));
    ((void**)pAligned)[-1] = pUnaligned;

    return pAligned;
}